

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O2

void __thiscall hmac_hash::SHA1::buffer_to_block(SHA1 *this,uint8_t *buffer,uint32_t *block)

{
  uint uVar1;
  size_t i;
  
  for (i = 0; i != 0x10; i = i + 1) {
    uVar1 = *(uint *)(buffer + i * 4);
    block[i] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  return;
}

Assistant:

void SHA1::buffer_to_block(const uint8_t* buffer, uint32_t* block) {
        for (size_t i = 0; i < BLOCK_INTS; ++i) {
            block[i] =
                (static_cast<uint32_t>(buffer[4 * i + 0]) << 24) |
                (static_cast<uint32_t>(buffer[4 * i + 1]) << 16) |
                (static_cast<uint32_t>(buffer[4 * i + 2]) << 8)  |
                (static_cast<uint32_t>(buffer[4 * i + 3]) << 0);
        }
    }